

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O1

VariableType * __thiscall rsg::VariableType::operator=(VariableType *this,VariableType *other)

{
  VariableType *pVVar1;
  VariableType *this_00;
  
  if (this != other) {
    pVVar1 = this->m_elementType;
    if (pVVar1 != (VariableType *)0x0) {
      ~VariableType(pVVar1);
      operator_delete(pVVar1,0x50);
    }
    this->m_elementType = (VariableType *)0x0;
    this->m_baseType = other->m_baseType;
    this->m_precision = other->m_precision;
    std::__cxx11::string::_M_assign((string *)&this->m_typeName);
    this->m_numElements = other->m_numElements;
    std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::operator=
              (&this->m_members,&other->m_members);
    this->m_elementType = (VariableType *)0x0;
    pVVar1 = other->m_elementType;
    if (pVVar1 != (VariableType *)0x0) {
      this_00 = (VariableType *)operator_new(0x50);
      VariableType(this_00,pVVar1);
      this->m_elementType = this_00;
    }
  }
  return this;
}

Assistant:

VariableType& VariableType::operator= (const VariableType& other)
{
	if (this == &other)
		return *this;

	delete m_elementType;

	m_elementType	= DE_NULL;
	m_baseType		= other.m_baseType;
	m_precision		= other.m_precision;
	m_typeName		= other.m_typeName;
	m_numElements	= other.m_numElements;
	m_members		= other.m_members;
	m_elementType	= DE_NULL;

	if (other.m_elementType)
		m_elementType = new VariableType(*other.m_elementType);

	return *this;
}